

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateSetAfterOp
          (IMC_Generator *this,OperationCombination comb,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::Token> *lValToken)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<nigel::Token> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_SFR> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_SFR> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  IM_Operator local_c8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  IM_Operator local_78;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  undefined1 local_38 [24];
  shared_ptr<nigel::Token> *lValToken_local;
  shared_ptr<nigel::IM_Operator> *lOp_local;
  IMC_Generator *pIStack_10;
  OperationCombination comb_local;
  IMC_Generator *this_local;
  
  local_38._16_8_ = lValToken;
  lValToken_local = (shared_ptr<nigel::Token> *)lOp;
  lOp_local._4_4_ = comb;
  pIStack_10 = this;
  if (((comb == vv) || (comb == vc)) || (comb == vt)) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_38);
    peVar3 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    iVar1 = *(int *)&(peVar3->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_38);
    if (iVar1 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_48,lOp);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_58,(nullptr_t)0x0);
      addCmd(this,mov_adr_a,&local_48,&local_58);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_58);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_48);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>(&local_78);
      peVar3 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_78);
      iVar1 = *(int *)&(peVar3->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_78);
      if (iVar1 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_88,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_98,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_88,&local_98);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_98);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_88);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a8,(nullptr_t)0x0);
        this_00 = &local_c8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)this_00,(nullptr_t)0x0);
        addCmd(this,movx_dptr_a,&local_a8,(shared_ptr<nigel::IM_Operator> *)this_00);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_c8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a8);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>(&local_c8);
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_c8);
        bVar2 = IM_Variable::isOnStack(peVar3);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_c8);
        if (bVar2) {
          IM_SFR::getSFR((SFR)&local_e8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_d8,&local_e8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f8,(nullptr_t)0x0);
          addCmd(this,mov_adr_a,&local_d8,&local_f8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_d8);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_e8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_108,lOp);
          generateLoadStackR0(this,&local_108);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_108);
          IM_SFR::getSFR((SFR)&local_128);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_118,&local_128)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_138,(nullptr_t)0x0);
          addCmd(this,mov_atr0_adr,&local_118,&local_138);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_138);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_118);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_128);
        }
      }
    }
  }
  else {
    std::shared_ptr<nigel::Token>::shared_ptr(&local_148,lValToken);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_cannotSetAConstantLiteral,&local_148);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_148);
  }
  return;
}

Assistant:

void IMC_Generator::generateSetAfterOp( OperationCombination comb, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<Token> lValToken )
	{
		if( comb == OC::vv || comb == OC::vc || comb == OC::vt )
		{//Is the same, because after a operation the value will be located in the acc.
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_a, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_dptr_a );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::SW ) );
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_atr0_adr, IM_SFR::getSFR( IM_SFR::SFR::SW ) );
			}
		}
		else generateNotification( NT::err_cannotSetAConstantLiteral, lValToken );
	}